

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TimingControlStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::TimingControlStatementSyntax_const&>
          (BumpAllocator *this,TimingControlStatementSyntax *args)

{
  TimingControlStatementSyntax *this_00;
  
  this_00 = (TimingControlStatementSyntax *)allocate(this,0x68,8);
  slang::syntax::TimingControlStatementSyntax::TimingControlStatementSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }